

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapedLattice.cpp
# Opt level: O0

void __thiscall OpenMD::shapedLattice::findSites(shapedLattice *this)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  value_type *in_RDI;
  Vector3d myOrt;
  Vector3d myPoint;
  int l;
  int k;
  int j;
  int i;
  int numMolPerCell;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> pointsOrt;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> latticePos;
  Lattice *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int iVar6;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
  *in_stack_ffffffffffffff60;
  undefined1 local_70 [12];
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_38;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_20;
  
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::clear
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x264e25)
  ;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::clear
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x264e33)
  ;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x264e40)
  ;
  Lattice::getLatticePointsOrt(in_stack_ffffffffffffff48);
  iVar2 = Lattice::getNumSitesPerCell((Lattice *)in_RDI[4].super_Vector<double,_3U>.data_[2]);
  iVar6 = iVar2;
  for (iVar5 = *(int *)(in_RDI[6].super_Vector<double,_3U>.data_ + 2);
      iVar5 <= *(int *)((long)in_RDI[7].super_Vector<double,_3U>.data_ + 4); iVar5 = iVar5 + 1) {
    for (iVar4 = *(int *)((long)in_RDI[6].super_Vector<double,_3U>.data_ + 0x14);
        iVar4 <= *(int *)(in_RDI[7].super_Vector<double,_3U>.data_ + 1); iVar4 = iVar4 + 1) {
      for (iVar3 = *(int *)in_RDI[7].super_Vector<double,_3U>.data_;
          iVar3 <= *(int *)((long)in_RDI[7].super_Vector<double,_3U>.data_ + 0xc); iVar3 = iVar3 + 1
          ) {
        Lattice::getLatticePointsPos
                  ((Lattice *)CONCAT44(iVar5,iVar4),
                   (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                   CONCAT44(iVar3,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa4,
                   in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        for (in_stack_ffffffffffffffa8 = 0; in_stack_ffffffffffffffa8 < iVar2;
            in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa8 + 1) {
          std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
          operator[](&local_20,(long)in_stack_ffffffffffffffa8);
          Vector3<double>::Vector3
                    ((Vector3<double> *)CONCAT44(iVar6,in_stack_ffffffffffffff50),
                     (Vector3<double> *)in_stack_ffffffffffffff48);
          bVar1 = (**(code **)((long)(in_RDI->super_Vector<double,_3U>).data_[0] + 0x10))
                            (in_RDI,local_70);
          in_stack_ffffffffffffff50 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff50);
          if ((bVar1 & 1) != 0) {
            std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            operator[](&local_20,(long)in_stack_ffffffffffffffa8);
            Vector3<double>::Vector3
                      ((Vector3<double> *)CONCAT44(iVar6,in_stack_ffffffffffffff50),
                       (Vector3<double> *)in_stack_ffffffffffffff48);
            std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            operator[](&local_38,(long)in_stack_ffffffffffffffa8);
            Vector3<double>::Vector3
                      ((Vector3<double> *)CONCAT44(iVar6,in_stack_ffffffffffffff50),
                       (Vector3<double> *)in_stack_ffffffffffffff48);
            std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            push_back(in_stack_ffffffffffffff60,in_RDI);
            std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            push_back(in_stack_ffffffffffffff60,in_RDI);
          }
        }
      }
    }
  }
  *(undefined1 *)(in_RDI[2].super_Vector<double,_3U>.data_ + 1) = 1;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector
            (in_stack_ffffffffffffff60);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector
            (in_stack_ffffffffffffff60);
  return;
}

Assistant:

void shapedLattice::findSites() {
    sites_.clear();
    orientations_.clear();

    std::vector<Vector3d> latticePos;
    std::vector<Vector3d> pointsOrt = simpleLattice_->getLatticePointsOrt();
    int numMolPerCell               = simpleLattice_->getNumSitesPerCell();

    for (int i = beginNx_; i <= endNx_; i++) {
      for (int j = beginNy_; j <= endNy_; j++) {
        for (int k = beginNz_; k <= endNz_; k++) {
          // get the position of the cell sites
          simpleLattice_->getLatticePointsPos(latticePos, i, j, k);
          for (int l = 0; l < numMolPerCell; l++) {
            if (isInterior(latticePos[l])) {
              Vector3d myPoint = latticePos[l];
              Vector3d myOrt   = pointsOrt[l];
              sites_.push_back(myPoint);
              orientations_.push_back(myOrt);
            }
          }
        }
      }
    }
    sitesComputed_ = true;
  }